

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

void __thiscall
Assembler::symbolTableEntry::symbolTableEntry
          (symbolTableEntry *this,string *symbolName,int section,int value,bool isGlobal,int size)

{
  int iVar1;
  int size_local;
  bool isGlobal_local;
  int value_local;
  int section_local;
  string *symbolName_local;
  symbolTableEntry *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)symbolName);
  this->section = section;
  this->value = value;
  this->isGlobal = isGlobal;
  iVar1 = generateId + 1;
  this->id = generateId;
  generateId = iVar1;
  this->size = size;
  return;
}

Assistant:

symbolTableEntry(string symbolName = "", int section = -2, int value = -2, bool isGlobal = false,
                         int size = 0) {
            this->symbolName = symbolName;
            this->section = section;
            this->value = value;
            this->isGlobal = isGlobal;
            this->id = generateId++;
            this->size = size;

        }